

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation_impl.cc
# Opt level: O3

void __thiscall webrtc::EchoCancellationImpl::AllocateRenderQueue(EchoCancellationImpl *this)

{
  size_t sVar1;
  SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>
  *pSVar2;
  ulong __n;
  CritScope cs_capture;
  CritScope cs_render;
  vector<float,_std::allocator<float>_> template_queue_element;
  CritScope local_40;
  CritScope local_38;
  RenderQueueItemVerifier<float> local_30;
  vector<float,_std::allocator<float>_> local_28;
  
  sVar1 = NumCancellersRequired(this);
  __n = sVar1 * 0xa0 + (ulong)(sVar1 * 0xa0 == 0);
  rtc::CritScope::CritScope(&local_38,this->crit_render_);
  rtc::CritScope::CritScope(&local_40,this->crit_capture_);
  if (this->render_queue_element_max_size_ < __n) {
    this->render_queue_element_max_size_ = __n;
    std::vector<float,_std::allocator<float>_>::vector(&local_28,__n,(allocator_type *)&local_30);
    pSVar2 = (SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>
              *)operator_new(0x70);
    local_30.minimum_capacity_ = this->render_queue_element_max_size_;
    SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>::
    SwapQueue(pSVar2,100,&local_28,&local_30);
    std::
    __uniq_ptr_impl<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>,_std::default_delete<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_>_>
    ::reset((__uniq_ptr_impl<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>,_std::default_delete<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_>_>
             *)&this->render_signal_queue_,pSVar2);
    std::vector<float,_std::allocator<float>_>::resize
              (&this->render_queue_buffer_,this->render_queue_element_max_size_);
    std::vector<float,_std::allocator<float>_>::resize
              (&this->capture_queue_buffer_,this->render_queue_element_max_size_);
    if (local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    pSVar2 = (this->render_signal_queue_)._M_t.
             super___uniq_ptr_impl<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>,_std::default_delete<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_*,_std::default_delete<webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_>_>
             .
             super__Head_base<0UL,_webrtc::SwapQueue<std::vector<float,_std::allocator<float>_>,_webrtc::RenderQueueItemVerifier<float>_>_*,_false>
             ._M_head_impl;
    rtc::CritScope::CritScope((CritScope *)&local_28,&pSVar2->crit_queue_);
    pSVar2->next_write_index_ = 0;
    pSVar2->next_read_index_ = 0;
    pSVar2->num_elements_ = 0;
    rtc::CritScope::~CritScope((CritScope *)&local_28);
  }
  rtc::CritScope::~CritScope(&local_40);
  rtc::CritScope::~CritScope(&local_38);
  return;
}

Assistant:

void EchoCancellationImpl::AllocateRenderQueue() {
  const size_t new_render_queue_element_max_size = std::max<size_t>(
      static_cast<size_t>(1),
      kMaxAllowedValuesOfSamplesPerFrame * NumCancellersRequired());

  rtc::CritScope cs_render(crit_render_);
  rtc::CritScope cs_capture(crit_capture_);

  // Reallocate the queue if the queue item size is too small to fit the
  // data to put in the queue.
  if (render_queue_element_max_size_ < new_render_queue_element_max_size) {
    render_queue_element_max_size_ = new_render_queue_element_max_size;

    std::vector<float> template_queue_element(render_queue_element_max_size_);

    render_signal_queue_.reset(
        new SwapQueue<std::vector<float>, RenderQueueItemVerifier<float>>(
            kMaxNumFramesToBuffer, template_queue_element,
            RenderQueueItemVerifier<float>(render_queue_element_max_size_)));

    render_queue_buffer_.resize(render_queue_element_max_size_);
    capture_queue_buffer_.resize(render_queue_element_max_size_);
  } else {
    render_signal_queue_->Clear();
  }
}